

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

LogSeverity jbcoin::Logs::fromString(string *s)

{
  string *psVar1;
  bool bVar2;
  bool local_191;
  bool local_161;
  bool local_119;
  bool local_e9;
  locale local_a0 [8];
  locale local_98 [15];
  byte local_89;
  locale local_88 [8];
  locale local_80 [15];
  byte local_71;
  locale local_70 [15];
  byte local_61;
  locale local_60 [8];
  locale local_58 [15];
  byte local_49;
  locale local_48 [8];
  locale local_40 [8];
  locale local_38 [24];
  locale local_20 [8];
  string *local_18;
  string *s_local;
  
  local_18 = s;
  std::locale::locale(local_20);
  bVar2 = boost::algorithm::iequals<std::__cxx11::string,char[6]>(s,(char (*) [6])"trace",local_20);
  std::locale::~locale(local_20);
  psVar1 = local_18;
  if (bVar2) {
    s_local._4_4_ = lsTRACE;
  }
  else {
    std::locale::locale(local_38);
    bVar2 = boost::algorithm::iequals<std::__cxx11::string,char[6]>
                      (psVar1,(char (*) [6])"debug",local_38);
    std::locale::~locale(local_38);
    psVar1 = local_18;
    if (bVar2) {
      s_local._4_4_ = lsDEBUG;
    }
    else {
      std::locale::locale(local_40);
      local_49 = 0;
      bVar2 = boost::algorithm::iequals<std::__cxx11::string,char[5]>
                        (psVar1,(char (*) [5])0x471117,local_40);
      psVar1 = local_18;
      local_e9 = true;
      if (!bVar2) {
        std::locale::locale(local_48);
        local_49 = 1;
        local_e9 = boost::algorithm::iequals<std::__cxx11::string,char[12]>
                             (psVar1,(char (*) [12])"information",local_48);
      }
      if ((local_49 & 1) != 0) {
        std::locale::~locale(local_48);
      }
      std::locale::~locale(local_40);
      psVar1 = local_18;
      if (local_e9 == false) {
        std::locale::locale(local_58);
        local_61 = 0;
        local_71 = 0;
        bVar2 = boost::algorithm::iequals<std::__cxx11::string,char[5]>
                          (psVar1,(char (*) [5])"warn",local_58);
        psVar1 = local_18;
        local_119 = true;
        if (!bVar2) {
          std::locale::locale(local_60);
          local_61 = 1;
          bVar2 = boost::algorithm::iequals<std::__cxx11::string,char[8]>
                            (psVar1,(char (*) [8])"warning",local_60);
          psVar1 = local_18;
          local_119 = true;
          if (!bVar2) {
            std::locale::locale(local_70);
            local_71 = 1;
            local_119 = boost::algorithm::iequals<std::__cxx11::string,char[9]>
                                  (psVar1,(char (*) [9])"warnings",local_70);
          }
        }
        if ((local_71 & 1) != 0) {
          std::locale::~locale(local_70);
        }
        if ((local_61 & 1) != 0) {
          std::locale::~locale(local_60);
        }
        std::locale::~locale(local_58);
        psVar1 = local_18;
        if (local_119 == false) {
          std::locale::locale(local_80);
          local_89 = 0;
          bVar2 = boost::algorithm::iequals<std::__cxx11::string,char[6]>
                            (psVar1,(char (*) [6])0x471108,local_80);
          psVar1 = local_18;
          local_161 = true;
          if (!bVar2) {
            std::locale::locale(local_88);
            local_89 = 1;
            local_161 = boost::algorithm::iequals<std::__cxx11::string,char[7]>
                                  (psVar1,(char (*) [7])"errors",local_88);
          }
          if ((local_89 & 1) != 0) {
            std::locale::~locale(local_88);
          }
          std::locale::~locale(local_80);
          psVar1 = local_18;
          if (local_161 == false) {
            std::locale::locale(local_98);
            bVar2 = boost::algorithm::iequals<std::__cxx11::string,char[6]>
                              (psVar1,(char (*) [6])"fatal",local_98);
            psVar1 = local_18;
            local_191 = true;
            if (!bVar2) {
              std::locale::locale(local_a0);
              local_191 = boost::algorithm::iequals<std::__cxx11::string,char[7]>
                                    (psVar1,(char (*) [7])"fatals",local_a0);
              std::locale::~locale(local_a0);
            }
            std::locale::~locale(local_98);
            if (local_191 == false) {
              s_local._4_4_ = lsINVALID;
            }
            else {
              s_local._4_4_ = lsFATAL;
            }
          }
          else {
            s_local._4_4_ = lsERROR;
          }
        }
        else {
          s_local._4_4_ = lsWARNING;
        }
      }
      else {
        s_local._4_4_ = lsINFO;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

LogSeverity
Logs::fromString (std::string const& s)
{
    if (boost::iequals (s, "trace"))
        return lsTRACE;

    if (boost::iequals (s, "debug"))
        return lsDEBUG;

    if (boost::iequals (s, "info") || boost::iequals (s, "information"))
        return lsINFO;

    if (boost::iequals (s, "warn") || boost::iequals (s, "warning") || boost::iequals (s, "warnings"))
        return lsWARNING;

    if (boost::iequals (s, "error") || boost::iequals (s, "errors"))
        return lsERROR;

    if (boost::iequals (s, "fatal") || boost::iequals (s, "fatals"))
        return lsFATAL;

    return lsINVALID;
}